

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

void llama_perf_context_print(llama_context *ctx)

{
  long lVar1;
  double t_end_ms;
  llama_perf_context_data data;
  double local_30;
  ggml_log_level local_28;
  double local_20;
  double local_18;
  uint local_10;
  uint local_c;
  
  llama_perf_context((llama_context *)t_end_ms);
  lVar1 = ggml_time_us();
  llama_log_internal(_local_28,(char *)0x2,"%s:        load time = %10.2f ms\n",
                     "llama_perf_context_print");
  llama_log_internal((ggml_log_level)local_20,(char *)(local_20 / (double)(int)local_10),
                     (1000.0 / local_20) * (double)(int)local_10,2,
                     "%s: prompt eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n"
                     ,"llama_perf_context_print",(ulong)local_10);
  llama_log_internal((ggml_log_level)local_18,(char *)(local_18 / (double)(int)local_c),
                     (1000.0 / local_18) * (double)(int)local_c,2,
                     "%s:        eval time = %10.2f ms / %5d runs   (%8.2f ms per token, %8.2f tokens per second)\n"
                     ,"llama_perf_context_print",(ulong)local_c);
  llama_log_internal((ggml_log_level)((double)lVar1 * 0.001 - local_30),(char *)0x2,
                     "%s:       total time = %10.2f ms / %5d tokens\n","llama_perf_context_print",
                     (ulong)(local_10 + local_c));
  return;
}

Assistant:

void llama_perf_context_print(const llama_context * ctx) {
    const auto data = llama_perf_context(ctx);

    const double t_end_ms = 1e-3 * ggml_time_us();

    LLAMA_LOG_INFO("%s:        load time = %10.2f ms\n", __func__, data.t_load_ms);
    LLAMA_LOG_INFO("%s: prompt eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n",
            __func__, data.t_p_eval_ms, data.n_p_eval, data.t_p_eval_ms / data.n_p_eval, 1e3 / data.t_p_eval_ms * data.n_p_eval);
    LLAMA_LOG_INFO("%s:        eval time = %10.2f ms / %5d runs   (%8.2f ms per token, %8.2f tokens per second)\n",
            __func__, data.t_eval_ms, data.n_eval, data.t_eval_ms / data.n_eval, 1e3 / data.t_eval_ms * data.n_eval);
    LLAMA_LOG_INFO("%s:       total time = %10.2f ms / %5d tokens\n", __func__, (t_end_ms - data.t_start_ms), (data.n_p_eval + data.n_eval));
}